

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xpath_ast_node * __thiscall
pugi::impl::anon_unknown_0::xpath_parser::parse_relative_location_path
          (xpath_parser *this,xpath_ast_node *set)

{
  lexeme_t lVar1;
  size_t sVar2;
  xpath_parse_result *pxVar3;
  xpath_ast_node *set_00;
  size_t sVar4;
  char_t *in_R9;
  
  set_00 = parse_step(this,set);
  if (set_00 != (xpath_ast_node *)0x0) {
    sVar2 = this->_depth;
    do {
      lVar1 = (this->_lexer)._cur_lexeme;
      if ((lVar1 & ~lex_equal) != lex_slash) {
        this->_depth = sVar2;
        return set_00;
      }
      xpath_lexer::next(&this->_lexer);
      if (lVar1 == lex_double_slash) {
        set_00 = alloc_node(this,(ast_type_t)set_00,(xpath_ast_node *)0x5,axis_attribute,
                            nodetest_none,in_R9);
        if (set_00 == (xpath_ast_node *)0x0) {
          return (xpath_ast_node *)0x0;
        }
        sVar4 = this->_depth + 1;
      }
      else {
        sVar4 = this->_depth;
      }
      this->_depth = sVar4 + 1;
      if (0x400 < sVar4 + 1) {
        pxVar3 = this->_result;
        pxVar3->error = "Exceeded maximum allowed query depth";
        pxVar3->offset = (long)(this->_lexer)._cur_lexeme_pos - (long)this->_query;
        return (xpath_ast_node *)0x0;
      }
      set_00 = parse_step(this,set_00);
    } while (set_00 != (xpath_ast_node *)0x0);
  }
  return (xpath_ast_node *)0x0;
}

Assistant:

xpath_ast_node* parse_relative_location_path(xpath_ast_node* set)
		{
			xpath_ast_node* n = parse_step(set);
			if (!n) return NULL;

			size_t old_depth = _depth;

			while (_lexer.current() == lex_slash || _lexer.current() == lex_double_slash)
			{
				lexeme_t l = _lexer.current();
				_lexer.next();

				if (l == lex_double_slash)
				{
					n = alloc_node(ast_step, n, axis_descendant_or_self, nodetest_type_node, NULL);
					if (!n) return NULL;

					++_depth;
				}

				if (++_depth > xpath_ast_depth_limit)
					return error_rec();

				n = parse_step(n);
				if (!n) return NULL;
			}

			_depth = old_depth;

			return n;
		}